

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

ExprList * sqlite3ExprListDup(sqlite3 *db,ExprList *p,int flags)

{
  Expr *pEVar1;
  char *pcVar2;
  Expr *pOldExpr;
  ExprList_item *pEStack_40;
  int i;
  ExprList_item *pOldItem;
  ExprList_item *pItem;
  ExprList *pNew;
  int flags_local;
  ExprList *p_local;
  sqlite3 *db_local;
  
  if (p == (ExprList *)0x0) {
    db_local = (sqlite3 *)0x0;
  }
  else {
    db_local = (sqlite3 *)sqlite3DbMallocRaw(db,0x10);
    if (db_local == (sqlite3 *)0x0) {
      db_local = (sqlite3 *)0x0;
    }
    else {
      *(undefined4 *)((long)&db_local->pVfs + 4) = 0;
      pOldExpr._4_4_ = p->nExpr;
      *(int *)&db_local->pVfs = pOldExpr._4_4_;
      if ((flags & 1U) == 0) {
        for (pOldExpr._4_4_ = 1; pOldExpr._4_4_ < p->nExpr; pOldExpr._4_4_ = pOldExpr._4_4_ * 2) {
        }
      }
      pOldItem = (ExprList_item *)sqlite3DbMallocRaw(db,pOldExpr._4_4_ << 5);
      db_local->pVdbe = (Vdbe *)pOldItem;
      if ((Vdbe *)pOldItem == (Vdbe *)0x0) {
        sqlite3DbFree(db,db_local);
        db_local = (sqlite3 *)0x0;
      }
      else {
        pEStack_40 = p->a;
        for (pOldExpr._4_4_ = 0; pOldExpr._4_4_ < p->nExpr; pOldExpr._4_4_ = pOldExpr._4_4_ + 1) {
          pEVar1 = sqlite3ExprDup(db,pEStack_40->pExpr,flags);
          pOldItem->pExpr = pEVar1;
          pcVar2 = sqlite3DbStrDup(db,pEStack_40->zName);
          pOldItem->zName = pcVar2;
          pcVar2 = sqlite3DbStrDup(db,pEStack_40->zSpan);
          pOldItem->zSpan = pcVar2;
          pOldItem->sortOrder = pEStack_40->sortOrder;
          pOldItem->field_0x19 = pOldItem->field_0x19 & 0xfe;
          pOldItem->iOrderByCol = pEStack_40->iOrderByCol;
          pOldItem->iAlias = pEStack_40->iAlias;
          pOldItem = pOldItem + 1;
          pEStack_40 = pEStack_40 + 1;
        }
      }
    }
  }
  return (ExprList *)db_local;
}

Assistant:

SQLITE_PRIVATE ExprList *sqlite3ExprListDup(sqlite3 *db, ExprList *p, int flags){
  ExprList *pNew;
  struct ExprList_item *pItem, *pOldItem;
  int i;
  if( p==0 ) return 0;
  pNew = sqlite3DbMallocRaw(db, sizeof(*pNew) );
  if( pNew==0 ) return 0;
  pNew->iECursor = 0;
  pNew->nExpr = i = p->nExpr;
  if( (flags & EXPRDUP_REDUCE)==0 ) for(i=1; i<p->nExpr; i+=i){}
  pNew->a = pItem = sqlite3DbMallocRaw(db,  i*sizeof(p->a[0]) );
  if( pItem==0 ){
    sqlite3DbFree(db, pNew);
    return 0;
  } 
  pOldItem = p->a;
  for(i=0; i<p->nExpr; i++, pItem++, pOldItem++){
    Expr *pOldExpr = pOldItem->pExpr;
    pItem->pExpr = sqlite3ExprDup(db, pOldExpr, flags);
    pItem->zName = sqlite3DbStrDup(db, pOldItem->zName);
    pItem->zSpan = sqlite3DbStrDup(db, pOldItem->zSpan);
    pItem->sortOrder = pOldItem->sortOrder;
    pItem->done = 0;
    pItem->iOrderByCol = pOldItem->iOrderByCol;
    pItem->iAlias = pOldItem->iAlias;
  }
  return pNew;
}